

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest.cc
# Opt level: O2

string * testing::internal::JsonUnitTestResultPrinter::TestPropertiesAsJson
                   (string *__return_storage_ptr__,TestResult *result,string *indent)

{
  TestProperty *pTVar1;
  Message *pMVar2;
  pointer *__ptr;
  int i;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_98;
  allocator<char> local_89;
  string *local_88;
  string *local_80;
  pointer local_78;
  string local_70;
  string local_50;
  
  local_88 = __return_storage_ptr__;
  local_80 = indent;
  Message::Message((Message *)&local_98);
  for (i = 0; i < (int)((ulong)((long)(result->test_properties_).
                                      super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                      ._M_impl.super__Vector_impl_data._M_finish -
                               (long)(result->test_properties_).
                                     super__Vector_base<testing::TestProperty,_std::allocator<testing::TestProperty>_>
                                     ._M_impl.super__Vector_impl_data._M_start) >> 6); i = i + 1) {
    pTVar1 = TestResult::GetTestProperty(result,i);
    std::operator<<((ostream *)(local_98._M_head_impl + 0x10),",\n");
    std::operator<<((ostream *)(local_98._M_head_impl + 0x10),(string *)local_80);
    std::operator<<((ostream *)(local_98._M_head_impl + 0x10),"\"");
    local_78 = (pTVar1->key_)._M_dataplus._M_p;
    pMVar2 = Message::operator<<((Message *)&local_98,&local_78);
    pMVar2 = Message::operator<<(pMVar2,(char (*) [4])"\": ");
    pMVar2 = Message::operator<<(pMVar2,(char (*) [2])0x147743);
    std::__cxx11::string::string<std::allocator<char>>
              ((string *)&local_70,(pTVar1->value_)._M_dataplus._M_p,&local_89);
    EscapeJson(&local_50,&local_70);
    pMVar2 = Message::operator<<(pMVar2,&local_50);
    Message::operator<<(pMVar2,(char (*) [2])0x147743);
    std::__cxx11::string::~string((string *)&local_50);
    std::__cxx11::string::~string((string *)&local_70);
  }
  StringStreamToString(local_88,local_98._M_head_impl);
  if (local_98._M_head_impl != (stringstream *)0x0) {
    (**(code **)(*(long *)local_98._M_head_impl + 8))();
  }
  return local_88;
}

Assistant:

std::string JsonUnitTestResultPrinter::TestPropertiesAsJson(
    const TestResult& result, const std::string& indent) {
  Message attributes;
  for (int i = 0; i < result.test_property_count(); ++i) {
    const TestProperty& property = result.GetTestProperty(i);
    attributes << ",\n"
               << indent << "\"" << property.key() << "\": "
               << "\"" << EscapeJson(property.value()) << "\"";
  }
  return attributes.GetString();
}